

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O0

h265_stream_t * h265_new(void)

{
  h265_stream_t *phVar1;
  h265_nal_t *phVar2;
  h265_vps_t *phVar3;
  h265_sps_t *phVar4;
  h265_pps_t *phVar5;
  h265_aud_t *phVar6;
  h265_slice_header_t *phVar7;
  videoinfo_t *pvVar8;
  int local_1c;
  int local_18;
  int i_2;
  int i_1;
  int i;
  h265_stream_t *h;
  
  phVar1 = (h265_stream_t *)calloc(1,0x9d8);
  phVar2 = (h265_nal_t *)calloc(1,0x20);
  phVar1->nal = phVar2;
  for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
    phVar3 = (h265_vps_t *)calloc(1,0x4f0);
    phVar1->vps_table[i_2] = phVar3;
  }
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    phVar4 = (h265_sps_t *)calloc(1,0x1ef8);
    phVar1->sps_table[local_18] = phVar4;
  }
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    phVar5 = (h265_pps_t *)calloc(1,0x1a08);
    phVar1->pps_table[local_1c] = phVar5;
  }
  phVar1->vps = phVar1->vps_table[0];
  phVar1->sps = phVar1->sps_table[0];
  phVar1->pps = phVar1->pps_table[0];
  phVar6 = (h265_aud_t *)calloc(1,1);
  phVar1->aud = phVar6;
  phVar1->num_seis = 0;
  phVar1->seis = (h265_sei_t **)0x0;
  phVar1->sei = (h265_sei_t *)0x0;
  phVar7 = (h265_slice_header_t *)calloc(1,0x660);
  phVar1->sh = phVar7;
  pvVar8 = (videoinfo_t *)calloc(1,0x40);
  phVar1->info = pvVar8;
  phVar1->info->type = 1;
  return phVar1;
}

Assistant:

h265_stream_t* h265_new()
{
    h265_stream_t* h = (h265_stream_t*)calloc(1, sizeof(h265_stream_t));

    h->nal = (h265_nal_t*)calloc(1, sizeof(h265_nal_t));

    // initialize tables
    for ( int i = 0; i < 16; i++ ) { h->vps_table[i] = (h265_vps_t*)calloc(1, sizeof(h265_vps_t)); }
    for ( int i = 0; i < 32; i++ ) { h->sps_table[i] = (h265_sps_t*)calloc(1, sizeof(h265_sps_t)); }
    for ( int i = 0; i < 256; i++ ) { h->pps_table[i] = (h265_pps_t*)calloc(1, sizeof(h265_pps_t)); }

    h->vps = h->vps_table[0];
    h->sps = h->sps_table[0];
    h->pps = h->pps_table[0];
    h->aud = (h265_aud_t*)calloc(1, sizeof(h265_aud_t));
    h->num_seis = 0;
    h->seis = NULL;
    h->sei = NULL;  //This is a TEMP pointer at whats in h->seis...
    h->sh = (h265_slice_header_t*)calloc(1, sizeof(h265_slice_header_t));

    h->info = (videoinfo_t*)calloc(1, sizeof(videoinfo_t));
    h->info->type = 1;
    return h;
}